

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall Logger::start(Logger *this)

{
  size_t sVar1;
  char buffer [16];
  time_t in_time_t;
  tm tm_snapshot;
  char local_98 [24];
  anon_class_8_1_8991fb9c_for__M_head_impl local_80 [2];
  undefined1 local_70 [24];
  tm local_58;
  
  this->running = true;
  local_70._16_8_ = std::chrono::_V2::system_clock::now();
  local_70._16_8_ = (long)local_70._16_8_ / 1000000000;
  localtime_r((time_t *)(local_70 + 0x10),(tm *)(local_70 + 0x18));
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  strftime(local_98,0x10,"%Y-%m-%d",(tm *)(local_70 + 0x18));
  local_80[0].this = (Logger *)local_70;
  sVar1 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,local_98,local_98 + sVar1);
  std::__cxx11::string::operator=((string *)&this->logCreateDate,(string *)local_80);
  if (local_80[0].this != (Logger *)local_70) {
    operator_delete(local_80[0].this);
  }
  createLogDir(this);
  createLogFile(this);
  local_80[0].this = this;
  std::thread::thread<Logger::start()::_lambda()_1_,,void>((thread *)(local_70 + 0x18),local_80);
  if ((this->logThread)._M_id._M_thread == 0) {
    (this->logThread)._M_id._M_thread = local_58._0_8_;
    local_80[0].this = this;
    std::thread::thread<Logger::start()::_lambda()_2_,,void>
              ((thread *)(local_70 + 0x18),(anon_class_8_1_8991fb9c_for__M_head_impl *)local_80);
    if ((this->timerThread)._M_id._M_thread == 0) {
      (this->timerThread)._M_id._M_thread = local_58._0_8_;
      usleep(100000);
      return;
    }
  }
  std::terminate();
}

Assistant:

inline void start() 
    {
        running = true;
        logCreateDate = getDate();  // 获取当前日期
        createLogDir();     // 创建日志目录
        createLogFile();    // 创建日志文件
        // 启动日志处理线程
        logThread = std::thread([this]() {
            // std::cout << "日志处理线程启动" << std::endl;
            while(running) {
                while(!logQueue.empty())  {
                    std::unique_lock<std::mutex> lock(logQueueMtx);  // 加锁
                    cv.wait(lock, [this]() { return !logQueue.empty() || !running; });
                    if (!running) break;
                    auto& msg = logQueue.front();
                    if(msg.level >= logLevel) writeLog(msg.level, msg.time, msg.message); // 写入日志
                    logQueue.pop();
                }
                LOG_SLEEP(10); // 等待10毫秒
            }
            // std::cout << "日志处理线程结束" << std::endl;
        });
        // 启动定时器线程,定时读取日志配置文件
        timerThread = std::thread([this]() {
            // std::cout << "定时器线程启动" << std::endl;
            while(running) {
                if (this->checkConfigFileChange()) {
                    this->loadConfig();
                }
                std::this_thread::sleep_for(std::chrono::seconds(5));
            }
            // std::cout << "定时器线程结束" << std::endl;
        });
        LOG_SLEEP(100); // 等待日志处理线程启动
    }